

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerators::MakeParentDirectory(cmQtAutoGenerators *this,char *logPrefix,string *filename)

{
  bool bVar1;
  bool bVar2;
  cmQtAutoGenerators *this_00;
  string error;
  string dirName;
  string local_80;
  size_type local_38;
  
  cmsys::SystemTools::GetFilenamePath((string *)&stack0xffffffffffffffc0,filename);
  bVar2 = true;
  if (local_38 != 0) {
    bVar1 = cmsys::SystemTools::MakeDirectory((string *)&stack0xffffffffffffffc0);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&local_80,logPrefix,(allocator *)&stack0xffffffffffffffa0);
      std::__cxx11::string::append((char *)&local_80);
      cmQtAutoGeneratorCommon::Quoted((string *)&stack0xffffffffffffffa0,filename);
      std::__cxx11::string::append((string *)&local_80);
      this_00 = (cmQtAutoGenerators *)&stack0xffffffffffffffa0;
      std::__cxx11::string::~string((string *)this_00);
      LogError(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return bVar2;
}

Assistant:

bool cmQtAutoGenerators::MakeParentDirectory(const char* logPrefix,
                                             const std::string& filename) const
{
  bool success = true;
  const std::string dirName = cmSystemTools::GetFilenamePath(filename);
  if (!dirName.empty()) {
    success = cmsys::SystemTools::MakeDirectory(dirName);
    if (!success) {
      std::string error = logPrefix;
      error += ": Error: Parent directory creation failed for ";
      error += Quoted(filename);
      this->LogError(error);
    }
  }
  return success;
}